

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

bool __thiscall
leveldb::InternalFilterPolicy::KeyMayMatch(InternalFilterPolicy *this,Slice *key,Slice *f)

{
  FilterPolicy *pFVar1;
  int iVar2;
  Slice local_30;
  Slice *local_20;
  Slice *f_local;
  Slice *key_local;
  InternalFilterPolicy *this_local;
  
  pFVar1 = this->user_policy_;
  local_20 = f;
  f_local = key;
  key_local = (Slice *)this;
  local_30 = ExtractUserKey(key);
  iVar2 = (*pFVar1->_vptr_FilterPolicy[4])(pFVar1,&local_30,local_20);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool InternalFilterPolicy::KeyMayMatch(const Slice& key, const Slice& f) const {
  return user_policy_->KeyMayMatch(ExtractUserKey(key), f);
}